

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpack.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  size_type sVar1;
  pointer pbVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char **ppcVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  undefined8 uVar11;
  cmCPackGenerator *this;
  undefined4 extraout_var;
  char *pcVar12;
  char *pcVar13;
  bool collapse;
  bool collapse_00;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 collapse_01;
  pointer name;
  uint uVar14;
  bool help;
  bool traceExpand;
  bool trace;
  bool verbose;
  bool debug;
  allocator<char> local_1839;
  allocator<char> local_1838;
  allocator<char> local_1837;
  allocator<char> local_1836;
  bool helpVersion;
  int local_1834;
  char **local_1830;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17f8;
  char local_17e8;
  uint local_17dc;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> v_1;
  CommandLineArguments arg;
  string local_1780;
  ScopePushPop raii;
  cmDocumentationEntry e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generatorsVector;
  string cpackProjectDirectory;
  string cpackProjectVendor;
  string cpackProjectVersion;
  string cpackBuildConfig;
  string cpackProjectName;
  string generator;
  CommandLineArguments args;
  string local_14c0;
  string systemFile;
  string cpackProjectPatch;
  string helpHTML;
  string helpMAN;
  string helpFull;
  cpackDefinitions definitions;
  cmCPackLog log;
  code *local_12c0 [2];
  code *local_12b0;
  code *local_12a8;
  cmDocumentation doc;
  cmCPackGeneratorFactory generators;
  cmMakefile globalMF;
  cmGlobalGenerator cmgg;
  cmake cminst;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,argc,argv);
  iVar5 = cmsys::Encoding::CommandLineArguments::argc(&args);
  ppcVar7 = cmsys::Encoding::CommandLineArguments::argv(&args);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*ppcVar7);
  cmCPackLog::cmCPackLog(&log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalMF,"CPack Error: ",(allocator<char> *)&cmgg);
  std::__cxx11::string::_M_assign((string *)&log.ErrorPrefix);
  std::__cxx11::string::~string((string *)&globalMF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalMF,"CPack Warning: ",(allocator<char> *)&cmgg);
  std::__cxx11::string::_M_assign((string *)&log.WarningPrefix);
  std::__cxx11::string::~string((string *)&globalMF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalMF,"CPack: ",(allocator<char> *)&cmgg);
  std::__cxx11::string::_M_assign((string *)&log.OutputPrefix);
  std::__cxx11::string::~string((string *)&globalMF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalMF,"CPack Verbose: ",(allocator<char> *)&cmgg);
  local_1830 = ppcVar7;
  std::__cxx11::string::_M_assign((string *)&log.VerbosePrefix);
  local_1834 = iVar5;
  std::__cxx11::string::~string((string *)&globalMF);
  uVar14 = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&globalMF,(SystemTools *)0x1,collapse);
  sVar3 = globalMF.FindPackageRootPathStack.
          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  std::__cxx11::string::~string((string *)&globalMF);
  if (sVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalMF);
    poVar8 = std::operator<<((ostream *)&globalMF,"Current working directory cannot be established."
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(&log,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0x7e,(char *)cmgg._vptr_cmGlobalGenerator);
    std::__cxx11::string::~string((string *)&cmgg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalMF);
    goto LAB_0013af4c;
  }
  generator._M_dataplus._M_p = (pointer)&generator.field_2;
  generator._M_string_length = 0;
  generator.field_2._M_local_buf[0] = '\0';
  help = false;
  helpVersion = false;
  verbose = false;
  trace = false;
  traceExpand = false;
  helpFull._M_dataplus._M_p = (pointer)&helpFull.field_2;
  helpFull._M_string_length = 0;
  helpMAN._M_dataplus._M_p = (pointer)&helpMAN.field_2;
  helpMAN._M_string_length = 0;
  helpFull.field_2._M_local_buf[0] = '\0';
  helpMAN.field_2._M_local_buf[0] = '\0';
  helpHTML._M_dataplus._M_p = (pointer)&helpHTML.field_2;
  helpHTML._M_string_length = 0;
  cpackProjectName._M_dataplus._M_p = (pointer)&cpackProjectName.field_2;
  cpackProjectName._M_string_length = 0;
  helpHTML.field_2._M_local_buf[0] = '\0';
  cpackProjectName.field_2._M_local_buf[0] = '\0';
  cpackProjectDirectory._M_dataplus._M_p = (pointer)&cpackProjectDirectory.field_2;
  cpackProjectDirectory._M_string_length = 0;
  cpackBuildConfig._M_dataplus._M_p = (pointer)&cpackBuildConfig.field_2;
  cpackBuildConfig._M_string_length = 0;
  cpackProjectDirectory.field_2._M_local_buf[0] = '\0';
  cpackBuildConfig.field_2._M_local_buf[0] = '\0';
  cpackProjectVersion._M_dataplus._M_p = (pointer)&cpackProjectVersion.field_2;
  cpackProjectVersion._M_string_length = 0;
  cpackProjectPatch._M_dataplus._M_p = (pointer)&cpackProjectPatch.field_2;
  cpackProjectPatch._M_string_length = 0;
  debug = false;
  cpackProjectVersion.field_2._M_local_buf[0] = '\0';
  cpackProjectPatch.field_2._M_local_buf[0] = '\0';
  cpackProjectVendor._M_dataplus._M_p = (pointer)&cpackProjectVendor.field_2;
  cpackProjectVendor._M_string_length = 0;
  definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header;
  definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cpackProjectVendor.field_2._M_local_buf[0] = '\0';
  definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1780._M_dataplus._M_p = (pointer)&local_1780.field_2;
  definitions.Map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1780._M_string_length = 0;
  local_1780.field_2._M_local_buf[0] = '\0';
  definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  definitions.Log = &log;
  cmsys::CommandLineArguments::CommandLineArguments(&arg);
  cmsys::CommandLineArguments::Initialize(&arg,local_1834,local_1830);
  cmsys::CommandLineArguments::AddArgument(&arg,"--help",NO_ARGUMENT,&help,"CPack help");
  cmsys::CommandLineArguments::AddArgument(&arg,"--help-full",SPACE_ARGUMENT,&helpFull,"CPack help")
  ;
  cmsys::CommandLineArguments::AddArgument(&arg,"--help-html",SPACE_ARGUMENT,&helpHTML,"CPack help")
  ;
  cmsys::CommandLineArguments::AddArgument(&arg,"--help-man",SPACE_ARGUMENT,&helpMAN,"CPack help");
  cmsys::CommandLineArguments::AddArgument(&arg,"--version",NO_ARGUMENT,&helpVersion,"CPack help");
  cmsys::CommandLineArguments::AddArgument(&arg,"-V",NO_ARGUMENT,&verbose,"CPack verbose");
  cmsys::CommandLineArguments::AddArgument(&arg,"--verbose",NO_ARGUMENT,&verbose,"-V");
  cmsys::CommandLineArguments::AddArgument(&arg,"--debug",NO_ARGUMENT,&debug,"-V");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--config",SPACE_ARGUMENT,&local_1780,"CPack configuration file");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--trace",NO_ARGUMENT,&trace,"Put underlying cmake scripts in trace mode.");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--trace-expand",NO_ARGUMENT,&traceExpand,
             "Put underlying cmake scripts in expanded trace mode.");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-C",SPACE_ARGUMENT,&cpackBuildConfig,"CPack build configuration");
  cmsys::CommandLineArguments::AddArgument(&arg,"-G",SPACE_ARGUMENT,&generator,"CPack generator");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-P",SPACE_ARGUMENT,&cpackProjectName,"CPack project name");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-R",SPACE_ARGUMENT,&cpackProjectVersion,"CPack project version");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-B",SPACE_ARGUMENT,&cpackProjectDirectory,"CPack project directory");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--patch",SPACE_ARGUMENT,&cpackProjectPatch,"CPack project patch");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--vendor",SPACE_ARGUMENT,&cpackProjectVendor,"CPack project vendor");
  cmsys::CommandLineArguments::AddCallback
            (&arg,"-D",SPACE_ARGUMENT,cpackDefinitionArgument,&definitions,"CPack Definitions");
  cmsys::CommandLineArguments::SetUnknownArgumentCallback(&arg,cpackUnknownArgument);
  iVar5 = cmsys::CommandLineArguments::Parse(&arg);
  if (verbose == true) {
    log.Verbose = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalMF);
    poVar8 = std::operator<<((ostream *)&globalMF,"Enable Verbose");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(&log,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0xc6,(char *)cmgg._vptr_cmGlobalGenerator);
    std::__cxx11::string::~string((string *)&cmgg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalMF);
  }
  if (debug == true) {
    log.Debug = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalMF);
    poVar8 = std::operator<<((ostream *)&globalMF,"Enable Debug");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(&log,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0xca,(char *)cmgg._vptr_cmGlobalGenerator);
    std::__cxx11::string::~string((string *)&cmgg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalMF);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalMF);
  poVar8 = std::operator<<((ostream *)&globalMF,"Read CPack config file: ");
  poVar8 = std::operator<<(poVar8,(string *)&local_1780);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(&log,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                  ,0xce,(char *)cmgg._vptr_cmGlobalGenerator);
  std::__cxx11::string::~string((string *)&cmgg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalMF);
  cmake::cmake(&cminst,RoleScript,CPack);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalMF,"",(allocator<char> *)&cmgg);
  cmake::SetHomeDirectory(&cminst,(string *)&globalMF);
  std::__cxx11::string::~string((string *)&globalMF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalMF,"",(allocator<char> *)&cmgg);
  cmake::SetHomeOutputDirectory(&cminst,(string *)&globalMF);
  std::__cxx11::string::~string((string *)&globalMF);
  local_12c0[1] = (code *)0x0;
  local_12c0[0] = cpackProgressCallback;
  local_12a8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
               ::_M_invoke;
  local_12b0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
               ::_M_manager;
  cmake::SetProgressCallback(&cminst,(ProgressCallbackType *)local_12c0);
  std::_Function_base::~_Function_base((_Function_base *)local_12c0);
  globalMF.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cminst.CurrentSnapshot.Position.Position;
  globalMF.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cminst.CurrentSnapshot.State;
  globalMF.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cminst.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&globalMF);
  cmGlobalGenerator::cmGlobalGenerator(&cmgg,&cminst);
  e.Name.field_2._M_allocated_capacity = cminst.CurrentSnapshot.Position.Position;
  e.Name._M_dataplus._M_p = (pointer)cminst.CurrentSnapshot.State;
  e.Name._M_string_length = (size_type)cminst.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(&globalMF,&cmgg,(cmStateSnapshot *)&e);
  sVar1 = local_1780._M_string_length;
  if (trace == true) {
    cminst.Trace = true;
  }
  if (traceExpand == true) {
    cminst.Trace = true;
    cminst.TraceExpand = true;
  }
  if (local_1780._M_string_length == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&e.Name,(SystemTools *)0x1,collapse_00);
    std::__cxx11::string::operator=((string *)&local_1780,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::append((char *)&local_1780);
  }
  cmCPackGeneratorFactory::cmCPackGeneratorFactory(&generators);
  generators.Logger = &log;
  cmDocumentation::cmDocumentation(&doc);
  cmDocumentation::addCPackStandardDocSections(&doc);
  iVar6 = local_1834;
  bVar4 = cmDocumentation::CheckOptions(&doc,local_1834,local_1830,"-G");
  help = iVar6 != 1 && bVar4;
  cmake::AddCMakePaths(&cminst);
  if ((iVar5 == 0) || ((help & 1U) != 0)) {
LAB_0013acca:
    if ((help & 1U) == 0) {
      bVar4 = cmSystemTools::GetErrorOccuredFlag();
      uVar14 = (uint)bVar4;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&e,"cpack",(allocator<char> *)&v)
      ;
      cmDocumentation::SetName(&doc,&e.Name);
      std::__cxx11::string::~string((string *)&e);
      cmDocumentation::SetSection(&doc,"Name",cmDocumentationName);
      cmDocumentation::SetSection(&doc,"Usage",cmDocumentationUsage);
      cmDocumentation::PrependSection(&doc,"Options",cmDocumentationOptions);
      v.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      v.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      v.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (; (_Rb_tree_header *)
             generators.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             != &generators.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header;
          generators.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               std::_Rb_tree_increment
                         (generators.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left)) {
        e.Name._M_dataplus._M_p = (pointer)&e.Name.field_2;
        e.Name._M_string_length = 0;
        e.Name.field_2._M_allocated_capacity =
             e.Name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        e.Brief._M_string_length = 0;
        e.Brief.field_2._M_local_buf[0] = '\0';
        e.CustomNamePrefix = ' ';
        e.Brief._M_dataplus._M_p = (pointer)&e.Brief.field_2;
        std::__cxx11::string::_M_assign((string *)&e);
        std::__cxx11::string::_M_assign((string *)&e.Brief);
        std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
        emplace_back<cmDocumentationEntry>(&v,&e);
        cmDocumentationEntry::~cmDocumentationEntry(&e);
      }
      cmDocumentation::SetSection(&doc,"Generators",&v);
      bVar4 = cmDocumentation::PrintRequestedDocumentation(&doc,(ostream *)&std::cout);
      uVar14 = (uint)!bVar4;
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&v);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CMakeDetermineSystem.cmake",(allocator<char> *)&v);
    cmMakefile::GetModulesFile(&systemFile,&globalMF,&e.Name);
    std::__cxx11::string::~string((string *)&e);
    bVar4 = cmMakefile::ReadListFile(&globalMF,&systemFile);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&v,"CMakeSystemSpecificInformation.cmake",(allocator<char> *)&v_1);
      cmMakefile::GetModulesFile(&e.Name,&globalMF,(string *)&v);
      std::__cxx11::string::operator=((string *)&systemFile,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&v);
      bVar4 = cmMakefile::ReadListFile(&globalMF,&systemFile);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar8 = std::operator<<((ostream *)&e,"Error reading CMakeSystemSpecificInformation.cmake")
        ;
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(&log,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x10a,(char *)v.
                                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_0013ac98;
      }
      if (cpackBuildConfig._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_BUILD_CONFIG",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,cpackBuildConfig._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&e);
      }
      bVar4 = cmsys::SystemTools::FileExists(&local_1780);
      if (bVar4) {
        cmsys::SystemTools::CollapseFullPath(&e.Name,&local_1780);
        std::__cxx11::string::operator=((string *)&local_1780,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar8 = std::operator<<((ostream *)&e,"Read CPack configuration file: ");
        poVar8 = std::operator<<(poVar8,(string *)&local_1780);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(&log,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x116,(char *)v.
                                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&v);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar4 = cmMakefile::ReadListFile(&globalMF,&local_1780);
        collapse_01 = extraout_DL_00;
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar8 = std::operator<<((ostream *)&e,"Problem reading CPack config file: \"");
          poVar8 = std::operator<<(poVar8,(string *)&local_1780);
          poVar8 = std::operator<<(poVar8,"\"");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(&log,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x11a,(char *)v.
                                         super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          goto LAB_0013ac98;
        }
      }
      else {
        collapse_01 = extraout_DL;
        if (sVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar8 = std::operator<<((ostream *)&e,"Cannot find CPack config file: \"");
          poVar8 = std::operator<<(poVar8,(string *)&local_1780);
          poVar8 = std::operator<<(poVar8,"\"");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(&log,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x120,(char *)v.
                                         super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          goto LAB_0013ac98;
        }
      }
      if (generator._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_GENERATOR",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,generator._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&e);
        collapse_01 = extraout_DL_01;
      }
      if (cpackProjectName._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_PACKAGE_NAME",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,cpackProjectName._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&e);
        collapse_01 = extraout_DL_02;
      }
      if (cpackProjectVersion._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_PACKAGE_VERSION",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,cpackProjectVersion._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&e);
        collapse_01 = extraout_DL_03;
      }
      if (cpackProjectVendor._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_PACKAGE_VENDOR",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,cpackProjectVendor._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&e);
        collapse_01 = extraout_DL_04;
      }
      if (cpackProjectDirectory._M_string_length == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&e.Name,(SystemTools *)0x1,(bool)collapse_01);
        std::__cxx11::string::operator=((string *)&cpackProjectDirectory,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_PACKAGE_DIRECTORY",(allocator<char> *)&v);
        bVar4 = cmMakefile::IsSet(&globalMF,&e.Name);
        std::__cxx11::string::~string((string *)&e);
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"CPACK_PACKAGE_DIRECTORY",(allocator<char> *)&v);
          cmMakefile::AddDefinition(&globalMF,&e.Name,cpackProjectDirectory._M_dataplus._M_p);
          goto LAB_0013b1a8;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CPACK_PACKAGE_DIRECTORY",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,cpackProjectDirectory._M_dataplus._M_p);
LAB_0013b1a8:
        std::__cxx11::string::~string((string *)&e);
      }
      for (p_Var9 = definitions.Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &definitions.Map._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        cmMakefile::AddDefinition(&globalMF,(string *)(p_Var9 + 1),*(char **)(p_Var9 + 2));
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CPACK_MODULE_PATH",(allocator<char> *)&v);
      pcVar10 = cmMakefile::GetDefinition(&globalMF,&e.Name);
      std::__cxx11::string::~string((string *)&e);
      if (pcVar10 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CMAKE_MODULE_PATH",(allocator<char> *)&v);
        cmMakefile::AddDefinition(&globalMF,&e.Name,pcVar10);
        std::__cxx11::string::~string((string *)&e);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CPACK_GENERATOR",(allocator<char> *)&v);
      pcVar10 = cmMakefile::GetDefinition(&globalMF,&e.Name);
      std::__cxx11::string::~string((string *)&e);
      if (pcVar10 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar8 = std::operator<<((ostream *)&e,"CPack generator not specified");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(&log,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x14d,(char *)v.
                                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&v);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        uVar14 = 0;
        bVar4 = true;
      }
      else {
        generatorsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        generatorsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        generatorsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,pcVar10,(allocator<char> *)&v);
        cmSystemTools::ExpandListArgument(&e.Name,&generatorsVector,false);
        std::__cxx11::string::~string((string *)&e);
        pbVar2 = generatorsVector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_17dc = 0;
        name = generatorsVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar4 = name == pbVar2;
          if (bVar4) break;
          raii.Makefile = &globalMF;
          cmMakefile::PushScope(raii.Makefile);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar8 = std::operator<<((ostream *)&e,"Specified generator: ");
          poVar8 = std::operator<<(poVar8,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(&log,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x155,(char *)v.
                                         super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&v);
          uVar11 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          local_1834 = (int)CONCAT71((int7)((ulong)uVar11 >> 8),1);
          local_1830 = (char **)((ulong)local_1830 & 0xffffffff00000000);
          if (iVar5 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"CPACK_PACKAGE_NAME",(allocator<char> *)&v);
            pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            if (pcVar10 == (char *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"CPack project name not specified");
              std::endl<char,std::char_traits<char>>(poVar8);
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(&log,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x158,(char *)v.
                                             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,"CPACK_PACKAGE_VERSION",&local_1836);
              pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
              if (pcVar10 != (char *)0x0) {
                std::__cxx11::string::~string((string *)&e);
LAB_0013b43d:
                this = cmCPackGeneratorFactory::NewGenerator(&generators,name);
                if (this == (cmCPackGenerator *)0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                  poVar8 = std::operator<<((ostream *)&e,"Could not create CPack generator: ");
                  poVar8 = std::operator<<(poVar8,(string *)name);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  std::__cxx11::stringbuf::str();
                  cmCPackLog::Log(&log,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x172,(char *)v.
                                                 super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                  std::__cxx11::string::~string((string *)&v);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                  cmDocumentation::cmDocumentation((cmDocumentation *)&e);
                  v_1.
                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  v_1.
                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  v_1.
                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  for (p_Var9 = generators.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_left;
                      (_Rb_tree_header *)p_Var9 !=
                      &generators.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header;
                      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
                    v.
                    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)&v.
                                   super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    v.
                    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    v.
                    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)((ulong)v.
                                          super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                  0xffffffffffffff00);
                    local_1808._M_allocated_capacity = (size_type)&local_17f8;
                    local_1808._8_8_ = 0;
                    local_17f8._M_local_buf[0] = '\0';
                    local_17e8 = ' ';
                    std::__cxx11::string::_M_assign((string *)&v);
                    std::__cxx11::string::_M_assign((string *)local_1808._M_local_buf);
                    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
                    emplace_back<cmDocumentationEntry>(&v_1,(cmDocumentationEntry *)&v);
                    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)&v);
                  }
                  cmDocumentation::SetSection((cmDocumentation *)&e,"Generators",&v_1);
                  std::operator<<((ostream *)&std::cerr,"\n");
                  cmDocumentation::PrintDocumentation
                            ((cmDocumentation *)&e,ListGenerators,(ostream *)&std::cerr);
                  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                            (&v_1);
                  cmDocumentation::~cmDocumentation((cmDocumentation *)&e);
LAB_0013b764:
                  iVar5 = 0;
                }
                else {
                  this->Trace = trace;
                  this->TraceExpand = traceExpand;
                  iVar6 = cmCPackGenerator::Initialize(this,name,&globalMF);
                  if (iVar6 == 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                    poVar8 = std::operator<<((ostream *)&e,"Cannot initialize the generator ");
                    poVar8 = std::operator<<(poVar8,(string *)name);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    std::__cxx11::stringbuf::str();
                    cmCPackLog::Log(&log,0x10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                    ,0x186,(char *)v.
                                                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    std::__cxx11::string::~string((string *)&v);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                    goto LAB_0013b764;
                  }
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,"CPACK_INSTALL_COMMANDS",&local_1836);
                pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
                if (pcVar10 == (char *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&v,"CPACK_INSTALL_SCRIPT",&local_1837);
                  pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&v);
                  if (pcVar10 != (char *)0x0) {
LAB_0013b7f4:
                    std::__cxx11::string::~string((string *)&v);
                    goto LAB_0013b7fc;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&v_1,"CPACK_INSTALLED_DIRECTORIES",&local_1838);
                  pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&v_1);
                  if (pcVar10 != (char *)0x0) {
                    std::__cxx11::string::~string((string *)&v_1);
                    goto LAB_0013b7f4;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_14c0,"CPACK_INSTALL_CMAKE_PROJECTS",&local_1839);
                  pcVar10 = cmMakefile::GetDefinition(&globalMF,&local_14c0);
                  std::__cxx11::string::~string((string *)&local_14c0);
                  std::__cxx11::string::~string((string *)&v_1);
                  std::__cxx11::string::~string((string *)&v);
                  std::__cxx11::string::~string((string *)&e);
                  if (pcVar10 == (char *)0x0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                    poVar8 = std::operator<<((ostream *)&e,
                                             "Please specify build tree of the project that uses CMake using CPACK_INSTALL_CMAKE_PROJECTS, specify CPACK_INSTALL_COMMANDS, CPACK_INSTALL_SCRIPT, or CPACK_INSTALLED_DIRECTORIES."
                                            );
                    std::endl<char,std::char_traits<char>>(poVar8);
                    std::__cxx11::stringbuf::str();
                    cmCPackLog::Log(&log,0x10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                    ,0x194,(char *)v.
                                                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    goto LAB_0013bbb2;
                  }
                }
                else {
LAB_0013b7fc:
                  std::__cxx11::string::~string((string *)&e);
                }
                if (iVar5 != 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e,"CPACK_PACKAGE_NAME",(allocator<char> *)&v);
                  local_1830 = (char **)cmMakefile::GetDefinition(&globalMF,(string *)&e);
                  std::__cxx11::string::~string((string *)&e);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                  poVar8 = std::operator<<((ostream *)&e,"Use generator: ");
                  iVar6 = (**this->_vptr_cmCPackGenerator)();
                  poVar8 = std::operator<<(poVar8,(char *)CONCAT44(extraout_var,iVar6));
                  std::endl<char,std::char_traits<char>>(poVar8);
                  std::__cxx11::stringbuf::str();
                  cmCPackLog::Log(&log,2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x19b,(char *)v.
                                                 super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                  std::__cxx11::string::~string((string *)&v);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                  poVar8 = std::operator<<((ostream *)&e,"For project: ");
                  poVar8 = std::operator<<(poVar8,(char *)local_1830);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  std::__cxx11::stringbuf::str();
                  cmCPackLog::Log(&log,2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x19d,(char *)v.
                                                 super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                  std::__cxx11::string::~string((string *)&v);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e,"CPACK_PACKAGE_VERSION",(allocator<char> *)&v);
                  pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
                  std::__cxx11::string::~string((string *)&e);
                  if (pcVar10 == (char *)0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&e,"CPACK_PACKAGE_VERSION_MAJOR",(allocator<char> *)&v);
                    pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
                    std::__cxx11::string::~string((string *)&e);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&e,"CPACK_PACKAGE_VERSION_MINOR",(allocator<char> *)&v);
                    pcVar12 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
                    std::__cxx11::string::~string((string *)&e);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&e,"CPACK_PACKAGE_VERSION_PATCH",(allocator<char> *)&v);
                    pcVar13 = cmMakefile::GetDefinition(&globalMF,(string *)&e);
                    std::__cxx11::string::~string((string *)&e);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                    poVar8 = std::operator<<((ostream *)&e,pcVar10);
                    poVar8 = std::operator<<(poVar8,".");
                    poVar8 = std::operator<<(poVar8,pcVar12);
                    poVar8 = std::operator<<(poVar8,".");
                    std::operator<<(poVar8,pcVar13);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&v,"CPACK_PACKAGE_VERSION",(allocator<char> *)&local_14c0);
                    std::__cxx11::stringbuf::str();
                    cmMakefile::AddDefinition
                              (&globalMF,(string *)&v,
                               (char *)v_1.
                                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                    std::__cxx11::string::~string((string *)&v_1);
                    std::__cxx11::string::~string((string *)&v);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                  }
                  iVar6 = (*this->_vptr_cmCPackGenerator[1])(this);
                  if (iVar6 == 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                    poVar8 = std::operator<<((ostream *)&e,"Error when generating package: ");
                    poVar8 = std::operator<<(poVar8,(char *)local_1830);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    std::__cxx11::stringbuf::str();
                    cmCPackLog::Log(&log,0x10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                    ,0x1b2,(char *)v.
                                                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    std::__cxx11::string::~string((string *)&v);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                    local_1834 = 0;
                    local_1830 = (char **)CONCAT44(local_1830._4_4_,iVar5);
                    local_17dc = 1;
                  }
                  else {
                    local_1830 = (char **)CONCAT44(local_1830._4_4_,iVar5);
                  }
                }
                goto LAB_0013bbc2;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&v,"CPACK_PACKAGE_VERSION_MAJOR",&local_1837);
              pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&v);
              if (pcVar10 == (char *)0x0) {
LAB_0013bb3b:
                std::__cxx11::string::~string((string *)&v);
                std::__cxx11::string::~string((string *)&e);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&v_1,"CPACK_PACKAGE_VERSION_MINOR",&local_1838);
                pcVar10 = cmMakefile::GetDefinition(&globalMF,(string *)&v_1);
                if (pcVar10 == (char *)0x0) {
                  std::__cxx11::string::~string((string *)&v_1);
                  goto LAB_0013bb3b;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_14c0,"CPACK_PACKAGE_VERSION_PATCH",&local_1839);
                pcVar10 = cmMakefile::GetDefinition(&globalMF,&local_14c0);
                std::__cxx11::string::~string((string *)&local_14c0);
                std::__cxx11::string::~string((string *)&v_1);
                std::__cxx11::string::~string((string *)&v);
                std::__cxx11::string::~string((string *)&e);
                if (pcVar10 != (char *)0x0) goto LAB_0013b43d;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"CPack project version not specified");
              poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
              poVar8 = std::operator<<(poVar8,
                                       "Specify CPACK_PACKAGE_VERSION, or CPACK_PACKAGE_VERSION_MAJOR, CPACK_PACKAGE_VERSION_MINOR, and CPACK_PACKAGE_VERSION_PATCH."
                                      );
              std::endl<char,std::char_traits<char>>(poVar8);
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(&log,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x167,(char *)v.
                                             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
            }
LAB_0013bbb2:
            std::__cxx11::string::~string((string *)&v);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
LAB_0013bbc2:
          cmMakefile::ScopePushPop::~ScopePushPop(&raii);
          name = name + 1;
          iVar5 = (int)local_1830;
        } while ((char)local_1834 != '\0');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&generatorsVector);
        uVar14 = local_17dc;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar8 = std::operator<<((ostream *)&e,"Error reading CMakeDetermineSystem.cmake");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(&log,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                      ,0x101,(char *)v.
                                     super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
LAB_0013ac98:
      std::__cxx11::string::~string((string *)&v);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar4 = false;
      uVar14 = 1;
    }
    std::__cxx11::string::~string((string *)&systemFile);
    if (bVar4) goto LAB_0013acca;
  }
  cmDocumentation::~cmDocumentation(&doc);
  cmCPackGeneratorFactory::~cmCPackGeneratorFactory(&generators);
  cmMakefile::~cmMakefile(&globalMF);
  cmGlobalGenerator::~cmGlobalGenerator(&cmgg);
  cmake::~cmake(&cminst);
  cmsys::CommandLineArguments::~CommandLineArguments(&arg);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&definitions);
  std::__cxx11::string::~string((string *)&local_1780);
  std::__cxx11::string::~string((string *)&cpackProjectVendor);
  std::__cxx11::string::~string((string *)&cpackProjectPatch);
  std::__cxx11::string::~string((string *)&cpackProjectVersion);
  std::__cxx11::string::~string((string *)&cpackBuildConfig);
  std::__cxx11::string::~string((string *)&cpackProjectDirectory);
  std::__cxx11::string::~string((string *)&cpackProjectName);
  std::__cxx11::string::~string((string *)&helpHTML);
  std::__cxx11::string::~string((string *)&helpMAN);
  std::__cxx11::string::~string((string *)&helpFull);
  std::__cxx11::string::~string((string *)&generator);
LAB_0013af4c:
  cmCPackLog::~cmCPackLog(&log);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return uVar14;
}

Assistant:

int main(int argc, char const* const* argv)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = args.argc();
  argv = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmCPackLog log;

  log.SetErrorPrefix("CPack Error: ");
  log.SetWarningPrefix("CPack Warning: ");
  log.SetOutputPrefix("CPack: ");
  log.SetVerbosePrefix("CPack Verbose: ");

  if (cmSystemTools::GetCurrentWorkingDirectory().empty()) {
    cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                "Current working directory cannot be established."
                  << std::endl);
    return 1;
  }

  std::string generator;
  bool help = false;
  bool helpVersion = false;
  bool verbose = false;
  bool trace = false;
  bool traceExpand = false;
  bool debug = false;
  std::string helpFull;
  std::string helpMAN;
  std::string helpHTML;

  std::string cpackProjectName;
  std::string cpackProjectDirectory;
  std::string cpackBuildConfig;
  std::string cpackProjectVersion;
  std::string cpackProjectPatch;
  std::string cpackProjectVendor;
  std::string cpackConfigFile;

  cpackDefinitions definitions;
  definitions.Log = &log;

  cpackConfigFile.clear();

  cmsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);
  typedef cmsys::CommandLineArguments argT;
  // Help arguments
  arg.AddArgument("--help", argT::NO_ARGUMENT, &help, "CPack help");
  arg.AddArgument("--help-full", argT::SPACE_ARGUMENT, &helpFull,
                  "CPack help");
  arg.AddArgument("--help-html", argT::SPACE_ARGUMENT, &helpHTML,
                  "CPack help");
  arg.AddArgument("--help-man", argT::SPACE_ARGUMENT, &helpMAN, "CPack help");
  arg.AddArgument("--version", argT::NO_ARGUMENT, &helpVersion, "CPack help");

  arg.AddArgument("-V", argT::NO_ARGUMENT, &verbose, "CPack verbose");
  arg.AddArgument("--verbose", argT::NO_ARGUMENT, &verbose, "-V");
  arg.AddArgument("--debug", argT::NO_ARGUMENT, &debug, "-V");
  arg.AddArgument("--config", argT::SPACE_ARGUMENT, &cpackConfigFile,
                  "CPack configuration file");
  arg.AddArgument("--trace", argT::NO_ARGUMENT, &trace,
                  "Put underlying cmake scripts in trace mode.");
  arg.AddArgument("--trace-expand", argT::NO_ARGUMENT, &traceExpand,
                  "Put underlying cmake scripts in expanded trace mode.");
  arg.AddArgument("-C", argT::SPACE_ARGUMENT, &cpackBuildConfig,
                  "CPack build configuration");
  arg.AddArgument("-G", argT::SPACE_ARGUMENT, &generator, "CPack generator");
  arg.AddArgument("-P", argT::SPACE_ARGUMENT, &cpackProjectName,
                  "CPack project name");
  arg.AddArgument("-R", argT::SPACE_ARGUMENT, &cpackProjectVersion,
                  "CPack project version");
  arg.AddArgument("-B", argT::SPACE_ARGUMENT, &cpackProjectDirectory,
                  "CPack project directory");
  arg.AddArgument("--patch", argT::SPACE_ARGUMENT, &cpackProjectPatch,
                  "CPack project patch");
  arg.AddArgument("--vendor", argT::SPACE_ARGUMENT, &cpackProjectVendor,
                  "CPack project vendor");
  arg.AddCallback("-D", argT::SPACE_ARGUMENT, cpackDefinitionArgument,
                  &definitions, "CPack Definitions");
  arg.SetUnknownArgumentCallback(cpackUnknownArgument);

  // Parse command line
  int parsed = arg.Parse();

  // Setup logging
  if (verbose) {
    log.SetVerbose(verbose);
    cmCPack_Log(&log, cmCPackLog::LOG_OUTPUT, "Enable Verbose" << std::endl);
  }
  if (debug) {
    log.SetDebug(debug);
    cmCPack_Log(&log, cmCPackLog::LOG_OUTPUT, "Enable Debug" << std::endl);
  }

  cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
              "Read CPack config file: " << cpackConfigFile << std::endl);

  cmake cminst(cmake::RoleScript, cmState::CPack);
  cminst.SetHomeDirectory("");
  cminst.SetHomeOutputDirectory("");
  cminst.SetProgressCallback(cpackProgressCallback);
  cminst.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator cmgg(&cminst);
  cmMakefile globalMF(&cmgg, cminst.GetCurrentSnapshot());
#if defined(__CYGWIN__)
  globalMF.AddDefinition("CMAKE_LEGACY_CYGWIN_WIN32", "0");
#endif

  if (trace) {
    cminst.SetTrace(true);
  }
  if (traceExpand) {
    cminst.SetTrace(true);
    cminst.SetTraceExpand(true);
  }

  bool cpackConfigFileSpecified = true;
  if (cpackConfigFile.empty()) {
    cpackConfigFile = cmSystemTools::GetCurrentWorkingDirectory();
    cpackConfigFile += "/CPackConfig.cmake";
    cpackConfigFileSpecified = false;
  }

  cmCPackGeneratorFactory generators;
  generators.SetLogger(&log);
  cmCPackGenerator* cpackGenerator = nullptr;

  cmDocumentation doc;
  doc.addCPackStandardDocSections();
  /* Were we invoked to display doc or to do some work ?
   * Unlike cmake launching cpack with zero argument
   * should launch cpack using "cpackConfigFile" if it exists
   * in the current directory.
   */
  help = doc.CheckOptions(argc, argv, "-G") && argc != 1;

  // This part is used for cpack documentation lookup as well.
  cminst.AddCMakePaths();

  if (parsed && !help) {
    // find out which system cpack is running on, so it can setup the search
    // paths, so FIND_XXX() commands can be used in scripts
    std::string systemFile =
      globalMF.GetModulesFile("CMakeDetermineSystem.cmake");
    if (!globalMF.ReadListFile(systemFile)) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Error reading CMakeDetermineSystem.cmake" << std::endl);
      return 1;
    }

    systemFile =
      globalMF.GetModulesFile("CMakeSystemSpecificInformation.cmake");
    if (!globalMF.ReadListFile(systemFile)) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Error reading CMakeSystemSpecificInformation.cmake"
                    << std::endl);
      return 1;
    }

    if (!cpackBuildConfig.empty()) {
      globalMF.AddDefinition("CPACK_BUILD_CONFIG", cpackBuildConfig.c_str());
    }

    if (cmSystemTools::FileExists(cpackConfigFile)) {
      cpackConfigFile = cmSystemTools::CollapseFullPath(cpackConfigFile);
      cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                  "Read CPack configuration file: " << cpackConfigFile
                                                    << std::endl);
      if (!globalMF.ReadListFile(cpackConfigFile)) {
        cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                    "Problem reading CPack config file: \""
                      << cpackConfigFile << "\"" << std::endl);
        return 1;
      }
    } else if (cpackConfigFileSpecified) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Cannot find CPack config file: \"" << cpackConfigFile
                                                      << "\"" << std::endl);
      return 1;
    }

    if (!generator.empty()) {
      globalMF.AddDefinition("CPACK_GENERATOR", generator.c_str());
    }
    if (!cpackProjectName.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_NAME", cpackProjectName.c_str());
    }
    if (!cpackProjectVersion.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_VERSION",
                             cpackProjectVersion.c_str());
    }
    if (!cpackProjectVendor.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_VENDOR",
                             cpackProjectVendor.c_str());
    }
    // if this is not empty it has been set on the command line
    // go for it. Command line override values set in config file.
    if (!cpackProjectDirectory.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_DIRECTORY",
                             cpackProjectDirectory.c_str());
    }
    // The value has not been set on the command line
    else {
      // get a default value (current working directory)
      cpackProjectDirectory = cmsys::SystemTools::GetCurrentWorkingDirectory();
      // use default value iff no value has been provided by the config file
      if (!globalMF.IsSet("CPACK_PACKAGE_DIRECTORY")) {
        globalMF.AddDefinition("CPACK_PACKAGE_DIRECTORY",
                               cpackProjectDirectory.c_str());
      }
    }
    for (auto const& cd : definitions.Map) {
      globalMF.AddDefinition(cd.first, cd.second.c_str());
    }

    const char* cpackModulesPath = globalMF.GetDefinition("CPACK_MODULE_PATH");
    if (cpackModulesPath) {
      globalMF.AddDefinition("CMAKE_MODULE_PATH", cpackModulesPath);
    }
    const char* genList = globalMF.GetDefinition("CPACK_GENERATOR");
    if (!genList) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "CPack generator not specified" << std::endl);
    } else {
      std::vector<std::string> generatorsVector;
      cmSystemTools::ExpandListArgument(genList, generatorsVector);
      for (std::string const& gen : generatorsVector) {
        cmMakefile::ScopePushPop raii(&globalMF);
        cmMakefile* mf = &globalMF;
        cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                    "Specified generator: " << gen << std::endl);
        if (parsed && !mf->GetDefinition("CPACK_PACKAGE_NAME")) {
          cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                      "CPack project name not specified" << std::endl);
          parsed = 0;
        }
        if (parsed &&
            !(mf->GetDefinition("CPACK_PACKAGE_VERSION") ||
              (mf->GetDefinition("CPACK_PACKAGE_VERSION_MAJOR") &&
               mf->GetDefinition("CPACK_PACKAGE_VERSION_MINOR") &&
               mf->GetDefinition("CPACK_PACKAGE_VERSION_PATCH")))) {
          cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                      "CPack project version not specified"
                        << std::endl
                        << "Specify CPACK_PACKAGE_VERSION, or "
                           "CPACK_PACKAGE_VERSION_MAJOR, "
                           "CPACK_PACKAGE_VERSION_MINOR, and "
                           "CPACK_PACKAGE_VERSION_PATCH."
                        << std::endl);
          parsed = 0;
        }
        if (parsed) {
          cpackGenerator = generators.NewGenerator(gen);
          if (cpackGenerator) {
            cpackGenerator->SetTrace(trace);
            cpackGenerator->SetTraceExpand(traceExpand);
          } else {
            cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                        "Could not create CPack generator: " << gen
                                                             << std::endl);
            // Print out all the valid generators
            cmDocumentation generatorDocs;
            std::vector<cmDocumentationEntry> v;
            for (auto const& g : generators.GetGeneratorsList()) {
              cmDocumentationEntry e;
              e.Name = g.first;
              e.Brief = g.second;
              v.push_back(std::move(e));
            }
            generatorDocs.SetSection("Generators", v);
            std::cerr << "\n";
            generatorDocs.PrintDocumentation(cmDocumentation::ListGenerators,
                                             std::cerr);
            parsed = 0;
          }

          if (parsed && !cpackGenerator->Initialize(gen, mf)) {
            cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                        "Cannot initialize the generator " << gen
                                                           << std::endl);
            parsed = 0;
          }

          if (!mf->GetDefinition("CPACK_INSTALL_COMMANDS") &&
              !mf->GetDefinition("CPACK_INSTALL_SCRIPT") &&
              !mf->GetDefinition("CPACK_INSTALLED_DIRECTORIES") &&
              !mf->GetDefinition("CPACK_INSTALL_CMAKE_PROJECTS")) {
            cmCPack_Log(
              &log, cmCPackLog::LOG_ERROR,
              "Please specify build tree of the project that uses CMake "
              "using CPACK_INSTALL_CMAKE_PROJECTS, specify "
              "CPACK_INSTALL_COMMANDS, CPACK_INSTALL_SCRIPT, or "
              "CPACK_INSTALLED_DIRECTORIES."
                << std::endl);
            parsed = 0;
          }
          if (parsed) {
            const char* projName = mf->GetDefinition("CPACK_PACKAGE_NAME");
            cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                        "Use generator: " << cpackGenerator->GetNameOfClass()
                                          << std::endl);
            cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                        "For project: " << projName << std::endl);

            const char* projVersion =
              mf->GetDefinition("CPACK_PACKAGE_VERSION");
            if (!projVersion) {
              const char* projVersionMajor =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_MAJOR");
              const char* projVersionMinor =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_MINOR");
              const char* projVersionPatch =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_PATCH");
              std::ostringstream ostr;
              ostr << projVersionMajor << "." << projVersionMinor << "."
                   << projVersionPatch;
              mf->AddDefinition("CPACK_PACKAGE_VERSION", ostr.str().c_str());
            }

            int res = cpackGenerator->DoPackage();
            if (!res) {
              cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                          "Error when generating package: " << projName
                                                            << std::endl);
              return 1;
            }
          }
        }
      }
    }
  }

  /* In this case we are building the documentation object
   * instance in order to create appropriate structure
   * in order to satisfy the appropriate --help-xxx request
   */
  if (help) {
    // Construct and print requested documentation.

    doc.SetName("cpack");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    doc.PrependSection("Options", cmDocumentationOptions);

    std::vector<cmDocumentationEntry> v;
    for (auto const& g : generators.GetGeneratorsList()) {
      cmDocumentationEntry e;
      e.Name = g.first;
      e.Brief = g.second;
      v.push_back(std::move(e));
    }
    doc.SetSection("Generators", v);

    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  if (cmSystemTools::GetErrorOccuredFlag()) {
    return 1;
  }

  return 0;
}